

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

uint If_DsdManCheckAndXor
               (If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,int LutSize,
               int fDerive,int fVerbose)

{
  If_DsdObj_t *pLits;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 *puVar16;
  int pFirsts [12];
  int pSSizes [12];
  ulong local_140;
  undefined1 *local_138;
  ulong local_130;
  ulong local_128;
  undefined1 *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  undefined1 *local_e0;
  ulong local_d8;
  ulong local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  int local_b8 [3];
  undefined1 local_ac [44];
  ulong local_80;
  ulong local_78;
  ulong local_70;
  int local_68 [3];
  undefined1 local_5c [44];
  
  uVar3 = *(uint *)&pObj->field_0x4;
  if (uVar3 < 0x18000000) {
    __assert_fail("pObj->nFans > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6f6,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  if ((int)(uVar3 >> 3 & 0x1f) <= LutSize) {
    __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6f7,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  If_DsdManGetSuppSizes(p,pObj,local_68);
  iVar12 = ~nSuppAll + LutSize + (*(uint *)&pObj->field_0x4 >> 3 & 0x1f);
  if (LutSize <= iVar12) {
    __assert_fail("LimitOut < LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6fa,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  uVar14 = (ulong)(uVar3 >> 0x1b);
  pLits = pObj + 1;
  local_130 = 1;
  uVar10 = 0;
  do {
    uVar9 = uVar10 + 1;
    if (uVar9 < uVar14) {
      iVar1 = local_68[uVar10];
      uVar15 = local_130;
      do {
        if ((local_68[uVar15] + iVar1 <= LutSize) &&
           ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - (local_68[uVar15] + iVar1)) <= iVar12))
        {
          if (fDerive == 0) {
            return 0xffffffff;
          }
          If_DsdManComputeFirstArray(p,(int *)pLits,*(uint *)&pObj->field_0x4 >> 0x1b,local_b8);
          uVar3 = If_DsdSign(p,pObj,(int)uVar10,local_b8[uVar10] + iFirst,0);
          uVar4 = If_DsdSign(p,pObj,(int)uVar15,local_b8[uVar15] + iFirst,0);
          if ((uMaskNot & (uVar4 | uVar3)) == 0) {
            return uVar4 | uVar3;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    local_130 = local_130 + 1;
    uVar10 = uVar9;
  } while (uVar9 != uVar14);
  if ((*(uint *)&pObj->field_0x4 & 0xf8000000) != 0x18000000) {
    local_128 = 2;
    local_140 = 1;
    uVar10 = 0;
    do {
      uVar9 = uVar10 + 1;
      if (uVar9 < uVar14) {
        local_138 = (undefined1 *)local_128;
        uVar15 = local_140;
        do {
          uVar11 = uVar15 + 1;
          if (uVar11 < uVar14) {
            iVar1 = local_68[uVar15];
            iVar2 = local_68[uVar10];
            puVar16 = local_138;
            do {
              iVar5 = local_68[(long)puVar16] + iVar1 + iVar2;
              if ((iVar5 <= LutSize) &&
                 ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar5) <= iVar12)) {
                if (fDerive == 0) {
                  return 0xffffffff;
                }
                If_DsdManComputeFirstArray
                          (p,(int *)pLits,*(uint *)&pObj->field_0x4 >> 0x1b,local_b8);
                uVar3 = If_DsdSign(p,pObj,(int)uVar10,local_b8[uVar10] + iFirst,0);
                uVar4 = If_DsdSign(p,pObj,(int)uVar15,local_b8[uVar15] + iFirst,0);
                uVar6 = If_DsdSign(p,pObj,(int)puVar16,local_b8[(long)puVar16] + iFirst,0);
                uVar6 = uVar6 | uVar4 | uVar3;
                if ((uMaskNot & uVar6) == 0) {
                  return uVar6;
                }
              }
              puVar16 = (undefined1 *)((long)puVar16 + 1);
            } while (puVar16 < uVar14);
          }
          local_138 = (undefined1 *)((long)local_138 + 1);
          uVar15 = uVar11;
        } while (uVar11 != uVar14);
      }
      local_128 = local_128 + 1;
      local_140 = local_140 + 1;
      uVar10 = uVar9;
    } while (uVar9 != uVar14);
    if ((*(uint *)&pObj->field_0x4 & 0xf8000000) != 0x20000000) {
      local_e0 = local_5c;
      local_e8 = 3;
      local_f0 = 2;
      local_f8 = 1;
      local_100 = local_ac;
      local_140 = 0;
      do {
        uVar10 = local_140 + 1;
        if (uVar10 < uVar14) {
          local_c0 = local_100;
          local_c8 = local_e0;
          local_d0 = local_f0;
          local_d8 = local_e8;
          uVar9 = local_f8;
          do {
            local_80 = uVar9 + 1;
            if (uVar9 + 1 < uVar14) {
              local_138 = local_c0;
              uVar15 = local_d0;
              uVar11 = local_d8;
              puVar16 = local_c8;
              do {
                if (uVar14 <= uVar15 + 1) break;
                local_78 = uVar15 + 1;
                iVar1 = local_68[uVar9];
                iVar2 = local_68[local_140];
                iVar5 = local_68[uVar15];
                lVar13 = 0;
                local_70 = uVar11;
                do {
                  iVar7 = *(int *)(puVar16 + lVar13) + iVar1 + iVar2 + iVar5;
                  if ((iVar7 <= LutSize) &&
                     ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar7) <= iVar12)) {
                    if (fDerive == 0) {
                      return 0xffffffff;
                    }
                    If_DsdManComputeFirstArray
                              (p,(int *)pLits,*(uint *)&pObj->field_0x4 >> 0x1b,local_b8);
                    uVar3 = If_DsdSign(p,pObj,(int)local_140,local_b8[local_140] + iFirst,0);
                    uVar4 = If_DsdSign(p,pObj,(int)uVar9,local_b8[uVar9] + iFirst,0);
                    uVar6 = If_DsdSign(p,pObj,(int)uVar15,local_b8[uVar15] + iFirst,0);
                    uVar8 = If_DsdSign(p,pObj,(int)uVar11,*(int *)(local_138 + lVar13) + iFirst,0);
                    uVar3 = uVar8 | uVar6 | uVar4 | uVar3;
                    if ((uMaskNot & uVar3) == 0) {
                      return uVar3;
                    }
                  }
                  uVar11 = uVar11 + 1;
                  lVar13 = lVar13 + 4;
                } while (uVar11 < uVar14);
                uVar11 = local_70 + 1;
                puVar16 = puVar16 + 4;
                local_138 = local_138 + 4;
                uVar15 = local_78;
              } while (local_78 < uVar14);
            }
            local_d8 = local_d8 + 1;
            local_d0 = local_d0 + 1;
            local_c8 = local_c8 + 4;
            local_c0 = local_c0 + 4;
            uVar9 = local_80;
          } while (local_80 != uVar14);
        }
        local_e8 = local_e8 + 1;
        local_f0 = local_f0 + 1;
        local_f8 = local_f8 + 1;
        local_e0 = local_e0 + 4;
        local_100 = local_100 + 4;
        local_140 = uVar10;
        if (uVar10 == uVar14) {
          return 0;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

unsigned If_DsdManCheckAndXor( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i[6], LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR];
    int nFans = If_DsdObjFaninNum(pObj), pFirsts[DAU_MAX_VAR];
    unsigned uRes;
    assert( pObj->nFans > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - pObj->nSupp + 1);
    assert( LimitOut < LutSize );
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 3 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 4 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    for ( i[3] = i[2]+1; i[3] < nFans; i[3]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]] + pSSizes[i[3]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0) | 
               If_DsdSign(p, pObj, i[3], iFirst + pFirsts[i[3]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    return 0;
}